

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# App.hpp
# Opt level: O3

App * __thiscall CLI::App::get_subcommand(App *this,string *subcom)

{
  pointer pcVar1;
  App *pAVar2;
  OptionNotFound *this_00;
  string local_40;
  
  pAVar2 = _find_subcommand(this,subcom,false,false);
  if (pAVar2 != (App *)0x0) {
    return pAVar2;
  }
  this_00 = (OptionNotFound *)__cxa_allocate_exception(0x38);
  local_40._M_dataplus._M_p = (pointer)&local_40.field_2;
  pcVar1 = (subcom->_M_dataplus)._M_p;
  ::std::__cxx11::string::_M_construct<char*>
            ((string *)&local_40,pcVar1,pcVar1 + subcom->_M_string_length);
  OptionNotFound::OptionNotFound(this_00,&local_40);
  __cxa_throw(this_00,&OptionNotFound::typeinfo,Error::~Error);
}

Assistant:

App *get_subcommand(std::string subcom) const {
        auto subc = _find_subcommand(subcom, false, false);
        if(subc == nullptr)
            throw OptionNotFound(subcom);
        return subc;
    }